

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

bool __thiscall
google::protobuf::FieldOptions::MergePartialFromCodedStream
          (FieldOptions *this,CodedInputStream *input)

{
  ExtensionSet *this_00;
  UnknownFieldSet *unknown_fields;
  int *piVar1;
  uint8 uVar2;
  int iVar3;
  int iVar4;
  uint8 *puVar5;
  void **ppvVar6;
  FieldOptions *pFVar7;
  bool bVar8;
  Limit limit;
  string *psVar9;
  uint32 tag;
  uint local_54;
  FieldOptions *local_50;
  uint local_44;
  UninterpretedOption *local_40;
  RepeatedPtrFieldBase *local_38;
  
  this_00 = &this->_extensions_;
  unknown_fields = &this->_unknown_fields_;
  local_38 = &(this->uninterpreted_option_).super_RepeatedPtrFieldBase;
LAB_001f0fdc:
  do {
    puVar5 = input->buffer_;
    if ((puVar5 < input->buffer_end_) && (tag = (uint32)(char)*puVar5, -1 < (char)*puVar5)) {
      input->last_tag_ = tag;
      input->buffer_ = puVar5 + 1;
    }
    else {
      tag = io::CodedInputStream::ReadTagFallback(input);
      input->last_tag_ = tag;
    }
    if (tag == 0) {
      return true;
    }
    switch(tag >> 3) {
    case 1:
      if ((tag & 7) == 0) {
        puVar5 = input->buffer_;
        local_50 = this;
        if ((puVar5 < input->buffer_end_) && (uVar2 = *puVar5, -1 < (char)uVar2)) {
          input->buffer_ = puVar5 + 1;
          bVar8 = true;
          local_54 = (int)(char)uVar2;
        }
        else {
          bVar8 = io::CodedInputStream::ReadVarint32Fallback(input,&local_54);
        }
        if (bVar8 == false) {
          return false;
        }
        local_44 = local_54;
        if (local_54 < 3) {
          *(byte *)local_50->_has_bits_ = (byte)local_50->_has_bits_[0] | 1;
          local_50->ctype_ = local_54;
        }
        else {
          UnknownFieldSet::AddVarint(unknown_fields,1,(long)(int)local_54);
        }
        if (bVar8 == false) {
          return false;
        }
        puVar5 = input->buffer_;
        this = local_50;
        if ((puVar5 < input->buffer_end_) && (*puVar5 == '\x10')) {
          input->buffer_ = puVar5 + 1;
LAB_001f116d:
          puVar5 = input->buffer_;
          if ((puVar5 < input->buffer_end_) && (uVar2 = *puVar5, -1 < (char)uVar2)) {
            input->buffer_ = puVar5 + 1;
            local_54 = (int)(char)uVar2;
          }
          else {
            bVar8 = io::CodedInputStream::ReadVarint32Fallback(input,&local_54);
            if (!bVar8) {
              return false;
            }
          }
          this->packed_ = local_54 != 0;
          *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 2;
          puVar5 = input->buffer_;
          if ((puVar5 < input->buffer_end_) && (*puVar5 == '\x18')) {
            input->buffer_ = puVar5 + 1;
LAB_001f11cd:
            puVar5 = input->buffer_;
            if ((puVar5 < input->buffer_end_) && (uVar2 = *puVar5, -1 < (char)uVar2)) {
              input->buffer_ = puVar5 + 1;
              local_54 = (int)(char)uVar2;
            }
            else {
              bVar8 = io::CodedInputStream::ReadVarint32Fallback(input,&local_54);
              if (!bVar8) {
                return false;
              }
            }
            this->deprecated_ = local_54 != 0;
            *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 8;
            puVar5 = input->buffer_;
            if ((puVar5 < input->buffer_end_) && (*puVar5 == '(')) {
              input->buffer_ = puVar5 + 1;
LAB_001f122d:
              puVar5 = input->buffer_;
              if ((puVar5 < input->buffer_end_) && (uVar2 = *puVar5, -1 < (char)uVar2)) {
                input->buffer_ = puVar5 + 1;
                local_54 = (int)(char)uVar2;
              }
              else {
                bVar8 = io::CodedInputStream::ReadVarint32Fallback(input,&local_54);
                if (!bVar8) {
                  return false;
                }
              }
              this->lazy_ = local_54 != 0;
              *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 4;
              puVar5 = input->buffer_;
              if ((puVar5 < input->buffer_end_) && (*puVar5 == 'J')) {
                input->buffer_ = puVar5 + 1;
LAB_001f128d:
                *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 0x10;
                if (this->experimental_map_key_ == (string *)internal::kEmptyString_abi_cxx11_) {
                  psVar9 = (string *)operator_new(0x20);
                  (psVar9->_M_dataplus)._M_p = (pointer)&psVar9->field_2;
                  psVar9->_M_string_length = 0;
                  (psVar9->field_2)._M_local_buf[0] = '\0';
                  this->experimental_map_key_ = psVar9;
                }
                bVar8 = internal::WireFormatLite::ReadString(input,this->experimental_map_key_);
                if (!bVar8) {
                  return false;
                }
                internal::WireFormat::VerifyUTF8StringFallback
                          ((this->experimental_map_key_->_M_dataplus)._M_p,
                           (int)this->experimental_map_key_->_M_string_length,PARSE);
                puVar5 = input->buffer_;
                if ((puVar5 < input->buffer_end_) && (*puVar5 == 'P')) {
                  input->buffer_ = puVar5 + 1;
LAB_001f1303:
                  puVar5 = input->buffer_;
                  if ((puVar5 < input->buffer_end_) && (uVar2 = *puVar5, -1 < (char)uVar2)) {
                    input->buffer_ = puVar5 + 1;
                    local_54 = (int)(char)uVar2;
                  }
                  else {
                    bVar8 = io::CodedInputStream::ReadVarint32Fallback(input,&local_54);
                    if (!bVar8) {
                      return false;
                    }
                  }
                  this->weak_ = local_54 != 0;
                  *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 0x20;
                  puVar5 = input->buffer_;
                  if (((1 < *(int *)&input->buffer_end_ - (int)puVar5) && (*puVar5 == 0xba)) &&
                     (puVar5[1] == '>')) {
                    input->buffer_ = puVar5 + 2;
                    pFVar7 = this;
LAB_001f1377:
                    while( true ) {
                      local_50 = pFVar7;
                      pFVar7 = local_50;
                      iVar3 = (local_50->uninterpreted_option_).super_RepeatedPtrFieldBase.
                              current_size_;
                      iVar4 = (local_50->uninterpreted_option_).super_RepeatedPtrFieldBase.
                              allocated_size_;
                      if (iVar3 < iVar4) {
                        ppvVar6 = (local_50->uninterpreted_option_).super_RepeatedPtrFieldBase.
                                  elements_;
                        (local_50->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ =
                             iVar3 + 1;
                        local_40 = (UninterpretedOption *)ppvVar6[iVar3];
                      }
                      else {
                        iVar3 = (local_50->uninterpreted_option_).super_RepeatedPtrFieldBase.
                                total_size_;
                        if (iVar4 == iVar3) {
                          internal::RepeatedPtrFieldBase::Reserve(local_38,iVar3 + 1);
                        }
                        piVar1 = &(pFVar7->uninterpreted_option_).super_RepeatedPtrFieldBase.
                                  allocated_size_;
                        *piVar1 = *piVar1 + 1;
                        local_40 = internal::
                                   GenericTypeHandler<google::protobuf::UninterpretedOption>::New();
                        ppvVar6 = (pFVar7->uninterpreted_option_).super_RepeatedPtrFieldBase.
                                  elements_;
                        iVar3 = (pFVar7->uninterpreted_option_).super_RepeatedPtrFieldBase.
                                current_size_;
                        (pFVar7->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ =
                             iVar3 + 1;
                        ppvVar6[iVar3] = local_40;
                      }
                      puVar5 = input->buffer_;
                      if ((puVar5 < input->buffer_end_) && (uVar2 = *puVar5, -1 < (char)uVar2)) {
                        input->buffer_ = puVar5 + 1;
                        local_54 = (int)(char)uVar2;
                      }
                      else {
                        bVar8 = io::CodedInputStream::ReadVarint32Fallback(input,&local_54);
                        if (!bVar8) {
                          return false;
                        }
                      }
                      iVar3 = input->recursion_depth_;
                      input->recursion_depth_ = iVar3 + 1;
                      if (input->recursion_limit_ <= iVar3) {
                        return false;
                      }
                      limit = io::CodedInputStream::PushLimit(input,local_54);
                      bVar8 = UninterpretedOption::MergePartialFromCodedStream(local_40,input);
                      if (!bVar8) {
                        return false;
                      }
                      if (input->legitimate_message_end_ != true) {
                        return false;
                      }
                      io::CodedInputStream::PopLimit(input,limit);
                      if (0 < input->recursion_depth_) {
                        input->recursion_depth_ = input->recursion_depth_ + -1;
                      }
                      puVar5 = input->buffer_;
                      if ((((int)input->buffer_end_ - (int)puVar5 < 2) || (*puVar5 != 0xba)) ||
                         (puVar5[1] != '>')) break;
                      input->buffer_ = puVar5 + 2;
                      pFVar7 = local_50;
                    }
                    this = local_50;
                    if ((input->buffer_ == input->buffer_end_) &&
                       ((input->buffer_size_after_limit_ != 0 ||
                        (input->total_bytes_read_ == input->current_limit_)))) {
                      input->last_tag_ = 0;
                      input->legitimate_message_end_ = true;
                      return true;
                    }
                  }
                }
              }
            }
          }
        }
        goto LAB_001f0fdc;
      }
      break;
    case 2:
      if ((tag & 7) == 0) goto LAB_001f116d;
      break;
    case 3:
      if ((tag & 7) == 0) goto LAB_001f11cd;
      break;
    case 4:
    case 6:
    case 7:
    case 8:
      break;
    case 5:
      if ((tag & 7) == 0) goto LAB_001f122d;
      break;
    case 9:
      if ((tag & 7) == 2) goto LAB_001f128d;
      break;
    case 10:
      if ((tag & 7) == 0) goto LAB_001f1303;
      break;
    default:
      if ((tag >> 3 == 999) && (pFVar7 = this, (tag & 7) == 2)) goto LAB_001f1377;
    }
    if ((tag & 7) == 4) {
      return true;
    }
    if (tag < 8000) {
      bVar8 = internal::WireFormat::SkipField(input,tag,unknown_fields);
    }
    else {
      bVar8 = internal::ExtensionSet::ParseField(this_00,tag,input,default_instance_,unknown_fields)
      ;
    }
    if (bVar8 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool FieldOptions::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional .google.protobuf.FieldOptions.CType ctype = 1 [default = STRING];
      case 1: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::google::protobuf::FieldOptions_CType_IsValid(value)) {
            set_ctype(static_cast< ::google::protobuf::FieldOptions_CType >(value));
          } else {
            mutable_unknown_fields()->AddVarint(1, value);
          }
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(16)) goto parse_packed;
        break;
      }

      // optional bool packed = 2;
      case 2: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_packed:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &packed_)));
          set_has_packed();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(24)) goto parse_deprecated;
        break;
      }

      // optional bool deprecated = 3 [default = false];
      case 3: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_deprecated:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &deprecated_)));
          set_has_deprecated();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(40)) goto parse_lazy;
        break;
      }

      // optional bool lazy = 5 [default = false];
      case 5: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_lazy:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &lazy_)));
          set_has_lazy();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(74)) goto parse_experimental_map_key;
        break;
      }

      // optional string experimental_map_key = 9;
      case 9: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_experimental_map_key:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_experimental_map_key()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->experimental_map_key().data(), this->experimental_map_key().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(80)) goto parse_weak;
        break;
      }

      // optional bool weak = 10 [default = false];
      case 10: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_weak:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &weak_)));
          set_has_weak();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(7994)) goto parse_uninterpreted_option;
        break;
      }

      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_uninterpreted_option:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_uninterpreted_option()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(7994)) goto parse_uninterpreted_option;
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        if ((8000u <= tag)) {
          DO_(_extensions_.ParseField(tag, input, default_instance_,
                                      mutable_unknown_fields()));
          continue;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}